

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tests.cpp
# Opt level: O1

void __thiscall
MatrixTests_AddMatrix_Test::~MatrixTests_AddMatrix_Test(MatrixTests_AddMatrix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MatrixTests, AddMatrix)
{
	mcc::matrix<double, 3, 3> first;
	mcc::matrix<double, 3, 3> second;

	std::fill(first.begin(), first.end(), 2.0);
	std::fill(second.begin(), second.end(), 3.0);

	mcc::matrix<double, 3, 3> result = first + second;
	const auto sum = std::accumulate(result.begin(), result.end(), 0.0);
	ASSERT_EQ(sum, first.size() * 5);
}